

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidExpandDims2(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_long> *this;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Rep *pRVar5;
  ulong uVar6;
  ConvolutionLayerParams *pCVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  NeuralNetworkLayer *pNVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  Tensor *pTVar15;
  void *pvVar16;
  ExpandDimsLayerParams *pEVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar21;
  Arena *pAVar22;
  Model m;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar5 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001b09f1:
    pRVar20 = &(MStack_78.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar2 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_001b09f1;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar16 = pRVar5->elements[iVar2];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar16 + 0x10),"A",puVar19);
  if (*(long *)((long)pvVar16 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar16 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar16 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar6 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar22);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (*(long *)((long)pvVar16 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar16 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar16 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar6 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar22);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar3] = 2;
  pRVar1->current_size_ = uVar3 + 1;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar5 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001b0b5d:
    pRVar20 = &(MStack_78.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar2 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_001b0b5d;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar16 = pRVar5->elements[iVar2];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar16 + 0x10),"B",puVar19);
  if (*(long *)((long)pvVar16 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar16 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar16 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar6 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar22);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar3] = 2;
  uVar21 = uVar3 + 1;
  (pAVar10->shape_).current_size_ = uVar21;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar21 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar21] = 1;
  uVar21 = uVar3 + 2;
  (pAVar10->shape_).current_size_ = uVar21;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar21 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar21] = 1;
  pRVar1->current_size_ = uVar3 + 3;
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar22);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar5 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001b0ce2:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar13);
  }
  else {
    iVar2 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_001b0ce2;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar2 + 1;
    pNVar13 = (NeuralNetworkLayer *)pRVar5->elements[iVar2];
  }
  uVar6 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
  if ((uVar6 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar13->name_,"ED",puVar19);
  pRVar5 = (pNVar13->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001b0d3d:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar2 = (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_001b0d3d;
    (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar16 = pRVar5->elements[iVar2];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3b8534);
  pRVar5 = (pNVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001b0d8d:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->output_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar2 = (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_001b0d8d;
    (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar16 = pRVar5->elements[iVar2];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3d8b56);
  pRVar5 = (pNVar13->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001b0ddd:
    pTVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                        ((pNVar13->inputtensor_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->inputtensor_).super_RepeatedPtrFieldBase,pTVar15);
  }
  else {
    iVar2 = (pNVar13->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar2) goto LAB_001b0ddd;
    (pNVar13->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pvVar16 = pRVar5->elements[iVar2];
  }
  *(undefined4 *)((long)pvVar16 + 0x24) = 1;
  pRVar5 = (pNVar13->outputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    iVar2 = (pNVar13->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar2 < pRVar5->allocated_size) {
      (pNVar13->outputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      pvVar16 = pRVar5->elements[iVar2];
      goto LAB_001b0e30;
    }
  }
  pTVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                      ((pNVar13->outputtensor_).super_RepeatedPtrFieldBase.arena_);
  pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar13->outputtensor_).super_RepeatedPtrFieldBase,pTVar15);
LAB_001b0e30:
  *(undefined4 *)((long)pvVar16 + 0x24) = 3;
  if (pNVar13->_oneof_case_[0] != 0x465) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 0x465;
    uVar6 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pEVar17 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::ExpandDimsLayerParams>(pAVar22);
    (pNVar13->layer_).expanddims_ = pEVar17;
  }
  pCVar7 = (pNVar13->layer_).convolution_;
  this = &pCVar7->kernelsize_;
  uVar3 = (pCVar7->kernelsize_).current_size_;
  uVar4 = (pCVar7->kernelsize_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements((RepeatedField<long> *)this);
  plVar11[uVar3] = 2;
  uVar21 = uVar3 + 1;
  (pCVar7->kernelsize_).current_size_ = uVar21;
  uVar4 = (pCVar7->kernelsize_).total_size_;
  if (uVar21 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements((RepeatedField<long> *)this);
  plVar11[uVar21] = -4;
  this->current_size_ = uVar3 + 2;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar8 = CoreML::Result::good(&local_48);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x131a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar8;
}

Assistant:

int testInvalidExpandDims2() {
    /*
     A -> expand dims -> B
     shape of A: (2)
     shape of B: (2, 1, 1)
     axes parameter = [2,-4]
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *shape_out = out->mutable_type()->mutable_multiarraytype();
    shape_out->add_shape(2);
    shape_out->add_shape(1);
    shape_out->add_shape(1);

    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l = nn->add_layers();
    l->set_name("ED");
    l->add_input("A");
    l->add_output("B");
    l->add_inputtensor()->set_rank(1);
    l->add_outputtensor()->set_rank(3);
    auto *params = l->mutable_expanddims();
    params->add_axes(2);
    params->add_axes(-4);

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}